

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

void ggml_vec_dot_f32(int n,float *s,float *x,float *y)

{
  long lVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  float fVar7;
  undefined1 auVar6 [16];
  float local_c0 [44];
  
  lVar1 = (long)(int)(n & 0xffffffe0);
  local_c0[0x18] = 0.0;
  local_c0[0x19] = 0.0;
  local_c0[0x1a] = 0.0;
  local_c0[0x1b] = 0.0;
  local_c0[0x1c] = 0.0;
  local_c0[0x1d] = 0.0;
  local_c0[0x1e] = 0.0;
  local_c0[0x1f] = 0.0;
  local_c0[0x10] = 0.0;
  local_c0[0x11] = 0.0;
  local_c0[0x12] = 0.0;
  local_c0[0x13] = 0.0;
  local_c0[0x14] = 0.0;
  local_c0[0x15] = 0.0;
  local_c0[0x16] = 0.0;
  local_c0[0x17] = 0.0;
  local_c0[8] = 0.0;
  local_c0[9] = 0.0;
  local_c0[10] = 0.0;
  local_c0[0xb] = 0.0;
  local_c0[0xc] = 0.0;
  local_c0[0xd] = 0.0;
  local_c0[0xe] = 0.0;
  local_c0[0xf] = 0.0;
  local_c0[0] = 0.0;
  local_c0[1] = 0.0;
  local_c0[2] = 0.0;
  local_c0[3] = 0.0;
  local_c0[4] = 0.0;
  local_c0[5] = 0.0;
  local_c0[6] = 0.0;
  local_c0[7] = 0.0;
  pfVar4 = x;
  pfVar5 = y;
  for (lVar3 = 0; lVar3 < lVar1; lVar3 = lVar3 + 0x20) {
    for (lVar2 = 0; lVar2 != 0x80; lVar2 = lVar2 + 0x20) {
      auVar6 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)pfVar5 + lVar2),
                               *(undefined1 (*) [32])((long)pfVar4 + lVar2),
                               *(undefined1 (*) [32])((long)local_c0 + lVar2));
      *(undefined1 (*) [32])((long)local_c0 + lVar2) = ZEXT1632(auVar6);
    }
    pfVar5 = pfVar5 + 0x20;
    pfVar4 = pfVar4 + 0x20;
  }
  fVar7 = local_c0[1] + local_c0[9] + local_c0[0x11] + local_c0[0x19];
  auVar6._0_4_ = local_c0[0] + local_c0[8] + local_c0[0x10] + local_c0[0x18] +
                 local_c0[4] + local_c0[0xc] + local_c0[0x14] + local_c0[0x1c];
  auVar6._4_4_ = fVar7 + fVar7;
  auVar6._8_4_ = local_c0[2] + local_c0[10] + local_c0[0x12] + local_c0[0x1a] +
                 local_c0[6] + local_c0[0xe] + local_c0[0x16] + local_c0[0x1e];
  auVar6._12_4_ =
       local_c0[3] + local_c0[0xb] + local_c0[0x13] + local_c0[0x1b] +
       local_c0[7] + local_c0[0xf] + local_c0[0x17] + local_c0[0x1f];
  auVar6 = vhaddps_avx(auVar6,auVar6);
  auVar6 = vhaddps_avx(auVar6,auVar6);
  fVar7 = auVar6._0_4_;
  for (; lVar1 < n; lVar1 = lVar1 + 1) {
    fVar7 = fVar7 + x[lVar1] * y[lVar1];
  }
  *s = fVar7;
  return;
}

Assistant:

inline static void ggml_vec_dot_f32(const int n, float * restrict s, const float * restrict x, const float * restrict y) {
    ggml_float sumf = 0.0;

#ifdef GGML_SIMD
    const int np = (n & ~(GGML_F32_STEP - 1));

    GGML_F32_VEC sum[GGML_F32_ARR] = { GGML_F32_VEC_ZERO };

    GGML_F32_VEC ax[GGML_F32_ARR];
    GGML_F32_VEC ay[GGML_F32_ARR];

    for (int i = 0; i < np; i += GGML_F32_STEP) {
        for (int j = 0; j < GGML_F32_ARR; j++) {
            ax[j] = GGML_F32_VEC_LOAD(x + i + j*GGML_F32_EPR);
            ay[j] = GGML_F32_VEC_LOAD(y + i + j*GGML_F32_EPR);

            sum[j] = GGML_F32_VEC_FMA(sum[j], ax[j], ay[j]);
        }
    }

    // reduce sum0..sum3 to sum0
    GGML_F32_VEC_REDUCE(sumf, sum);

    // leftovers
    for (int i = np; i < n; ++i) {
        sumf += x[i]*y[i];
    }
#else
    // scalar
    for (int i = 0; i < n; ++i) {
        sumf += x[i]*y[i];
    }
#endif

    *s = sumf;
}